

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.pb.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::CodeGeneratorResponse::Clear(CodeGeneratorResponse *this)

{
  void **ppvVar1;
  Rep *pRVar2;
  string *psVar3;
  long lVar4;
  long lVar5;
  
  lVar5 = (long)(this->file_).super_RepeatedPtrFieldBase.current_size_;
  if (0 < lVar5) {
    pRVar2 = (this->file_).super_RepeatedPtrFieldBase.rep_;
    lVar4 = 0;
    do {
      ppvVar1 = pRVar2->elements + lVar4;
      lVar4 = lVar4 + 1;
      CodeGeneratorResponse_File::Clear((CodeGeneratorResponse_File *)*ppvVar1);
    } while (lVar5 != lVar4);
    (this->file_).super_RepeatedPtrFieldBase.current_size_ = 0;
  }
  if (((this->_has_bits_).has_bits_[0] & 1) != 0) {
    psVar3 = (this->error_).ptr_;
    psVar3->_M_string_length = 0;
    *(psVar3->_M_dataplus)._M_p = '\0';
  }
  (this->_has_bits_).has_bits_[0] = 0;
  if (((ulong)(this->_internal_metadata_).
              super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
              .ptr_ & 1) == 0) {
    return;
  }
  internal::InternalMetadataWithArena::DoClear(&this->_internal_metadata_);
  return;
}

Assistant:

void CodeGeneratorResponse::Clear() {
// @@protoc_insertion_point(message_clear_start:google.protobuf.compiler.CodeGeneratorResponse)
  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  file_.Clear();
  cached_has_bits = _has_bits_[0];
  if (cached_has_bits & 0x00000001u) {
    error_.ClearNonDefaultToEmptyNoArena();
  }
  _has_bits_.Clear();
  _internal_metadata_.Clear();
}